

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shortest-paths.hxx
# Opt level: O3

bool andres::graph::
     spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *g,
               SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *mask,size_t vs,size_t vt,deque<unsigned_long,_std::allocator<unsigned_long>_> *path,
               vector<long,_std::allocator<long>_> *parents)

{
  pointer pNVar1;
  size_t *psVar2;
  pointer plVar3;
  pointer pRVar4;
  pointer pAVar5;
  Value *pVVar6;
  _Elt_pointer puVar7;
  ulong *puVar8;
  vector<long,_std::allocator<long>_> *pvVar9;
  bool bVar10;
  size_t sVar11;
  pointer plVar12;
  pointer pAVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *pGVar17;
  Value VVar18;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queues [2];
  Value local_128;
  size_t local_120;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_118;
  vector<long,_std::allocator<long>_> *local_110;
  long local_108;
  size_t local_100;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  size_t *local_c8;
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_c0 [8];
  deque<unsigned_long,std::allocator<unsigned_long>> local_b8 [8];
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_b0 [8];
  size_t *local_a8;
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_a0 [8];
  long local_98;
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_90 [8];
  deque<unsigned_long,std::allocator<unsigned_long>> local_88 [16];
  ulong *local_78;
  ulong *local_58;
  long local_48;
  
  local_120 = vs;
  local_100 = vt;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(path);
  sVar11 = mask->firstFrame_;
  pNVar1 = (mask->problem_->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar14 = (size_t)pNVar1[vs].t;
  if ((sVar11 != sVar14 && sVar11 + 1 != sVar14) ||
     (sVar14 = (size_t)pNVar1[vt].t, sVar11 != sVar14 && sVar11 + 1 != sVar14)) {
    return false;
  }
  if (vt == vs) {
    psVar2 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (psVar2 == (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_back_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_120);
    }
    else {
      *psVar2 = vs;
      (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur = psVar2 + 1;
    }
    return true;
  }
  local_118 = g;
  std::vector<long,_std::allocator<long>_>::resize
            (parents,(long)(g->vertices_).
                           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(g->vertices_).
                           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
  plVar12 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  plVar3 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar12 != plVar3) {
    memset(plVar12,0,((long)plVar3 + (-8 - (long)plVar12) & 0xfffffffffffffff8U) + 8);
    vs = local_120;
  }
  plVar12[vs] = vs + 1;
  plVar12[local_100] = ~local_100;
  lVar16 = 0;
  do {
    *(undefined8 *)(local_88 + lVar16 + -0x10) = 0;
    *(undefined8 *)(local_88 + lVar16 + -8) = 0;
    *(undefined8 *)(local_88 + lVar16 + -0x20) = 0;
    *(undefined8 *)(local_88 + lVar16 + -0x18) = 0;
    *(undefined8 *)(local_88 + lVar16 + -0x30) = 0;
    *(undefined8 *)(local_88 + lVar16 + -0x28) = 0;
    *(undefined8 *)(local_88 + lVar16 + -0x40) = 0;
    *(undefined8 *)(local_88 + lVar16 + -0x38) = 0;
    (((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d8 + lVar16))->_M_impl).
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    *(undefined8 *)(local_88 + lVar16 + -0x48) = 0;
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d8 + lVar16),0);
    lVar16 = lVar16 + 0x50;
  } while (lVar16 != 0xa0);
  if (local_a8 == (size_t *)(local_98 + -8)) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<unsigned_long,std::allocator<unsigned_long>> *)local_d8,&local_120);
  }
  else {
    *local_a8 = local_120;
    local_a8 = local_a8 + 1;
  }
  pGVar17 = local_118;
  if (local_58 == (ulong *)(local_48 + -8)) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              (local_88,&local_100);
  }
  else {
    *local_58 = local_100;
    local_58 = local_58 + 1;
  }
  local_108 = 0;
  local_110 = parents;
  while( true ) {
    lVar16 = local_108 * 0x50;
    local_f0 = (*(long *)(local_88 + lVar16 + -0x30) - *(long *)(local_88 + lVar16 + -0x40) >> 3) +
               (*(long *)(local_88 + lVar16 + -0x20) - *(long *)(local_88 + lVar16 + -0x18) >> 3) +
               ((((ulong)(*(long *)(local_88 + lVar16 + -8) - *(long *)(local_88 + lVar16 + -0x28))
                 >> 3) - 1) + (ulong)(*(long *)(local_88 + lVar16 + -8) == 0)) * 0x40;
    if (local_f0 != 0) {
      local_f8 = (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (local_d8 + local_108 * 0x50);
      lVar16 = 0;
      do {
        uVar15 = *(local_f8->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        local_e8 = lVar16;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(local_f8);
        pRVar4 = (pGVar17->vertices_).
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar13 = *(pointer *)
                   &pRVar4[uVar15].vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
        ;
        pAVar5 = *(pointer *)
                  ((long)&pRVar4[uVar15].vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                  + 8);
        if (pAVar13 != pAVar5) {
          local_e0 = ~uVar15;
          if (local_108 == 0) {
            local_e0 = uVar15 + 1;
          }
          do {
            bVar10 = lineage::ProblemGraph::
                     SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::edge(mask,pAVar13->edge_);
            pvVar9 = local_110;
            if ((bVar10) &&
               (VVar18 = pAVar13->vertex_,
               sVar11 = (size_t)(mask->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[VVar18].t,
               mask->firstFrame_ + 1 == sVar11 || mask->firstFrame_ == sVar11)) {
              plVar12 = (local_110->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar16 = plVar12[VVar18];
              if ((local_108 == 0) && (lVar16 < 0)) goto LAB_0011da77;
              if ((local_108 == 1) && (0 < lVar16)) goto LAB_0011db07;
              if (lVar16 == 0) {
                plVar12[VVar18] = local_e0;
                local_128 = pAVar13->vertex_;
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(local_f8,&local_128);
              }
            }
            pAVar13 = pAVar13 + 1;
          } while (pAVar13 != pAVar5);
        }
        lVar16 = local_e8 + 1;
        pGVar17 = local_118;
      } while (lVar16 != local_f0);
    }
    if ((local_a8 == local_c8) && (local_58 == local_78)) break;
    local_108 = 1 - local_108;
  }
  bVar10 = false;
  goto LAB_0011db8c;
LAB_0011db07:
  do {
    puVar7 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    local_128 = VVar18;
    if (puVar7 == (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_front_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_128);
      plVar12 = (pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      puVar7[-1] = VVar18;
      (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur = puVar7 + -1;
    }
    VVar18 = plVar12[local_128] - 1;
  } while (VVar18 != local_128);
  do {
    puVar8 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_128 = uVar15;
    if (puVar8 == (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_back_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_128);
      plVar12 = (pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      *puVar8 = uVar15;
      (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur = puVar8 + 1;
    }
    uVar15 = ~plVar12[local_128];
  } while ((local_128 ^ plVar12[local_128]) != 0xffffffffffffffff);
  goto LAB_0011db8a;
LAB_0011da77:
  do {
    puVar7 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    local_128 = uVar15;
    if (puVar7 == (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_front_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_128);
      plVar12 = (pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      puVar7[-1] = uVar15;
      (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur = puVar7 + -1;
    }
    uVar15 = plVar12[local_128] - 1;
  } while (uVar15 != local_128);
  do {
    pVVar6 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_128 = VVar18;
    if (pVVar6 == (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_back_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_128);
      plVar12 = (pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      *pVVar6 = VVar18;
      (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur = pVVar6 + 1;
    }
    VVar18 = ~plVar12[local_128];
  } while ((local_128 ^ plVar12[local_128]) != 0xffffffffffffffff);
LAB_0011db8a:
  bVar10 = true;
LAB_0011db8c:
  lVar16 = 0x50;
  do {
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d8 + lVar16));
    lVar16 = lVar16 + -0x50;
  } while (lVar16 != -0x50);
  return bVar10;
}

Assistant:

bool 
spsp(
    const GRAPH& g, 
    const SUBGRAPH_MASK& mask,
    const std::size_t vs,
    const std::size_t vt,
    std::deque<std::size_t>& path,
    std::vector<std::ptrdiff_t>& parents// = std::vector<std::ptrdiff_t>()
) {
    path.clear();
    if(!mask.vertex(vs) || !mask.vertex(vt)) {
        return false;
    }
    if(vs == vt) {
        path.push_back(vs);
        return true;
    }
    parents.resize(g.numberOfVertices());
    std::fill(parents.begin(), parents.end(), 0);
    parents[vs] = vs + 1;
    parents[vt] = -static_cast<std::ptrdiff_t>(vt) - 1;
    std::queue<std::size_t> queues[2];
    queues[0].push(vs);
    queues[1].push(vt);
    for(std::size_t q = 0; true; q = 1 - q) { // infinite loop, alternating queues
        const std::size_t numberOfNodesAtFront = queues[q].size();
        for(std::size_t n = 0; n < numberOfNodesAtFront; ++n) {
            const std::size_t v = queues[q].front();
            queues[q].pop();
            typename GRAPH::AdjacencyIterator it;
            typename GRAPH::AdjacencyIterator end;
            if(q == 0) {
                it = g.adjacenciesFromVertexBegin(v);
                end = g.adjacenciesFromVertexEnd(v);
            }
            else {
                it = g.adjacenciesToVertexBegin(v);
                end = g.adjacenciesToVertexEnd(v);
            }
            for(; it != end; ++it) {
                if(!mask.edge(it->edge()) || !mask.vertex(it->vertex())) {
                    continue;
                }
                if(parents[it->vertex()] < 0 && q == 0) {
                    graph_detail::spspHelper(parents, v, it->vertex(), path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] > 0 && q == 1) {
                    graph_detail::spspHelper(parents, it->vertex(), v, path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] == 0) {
                    if(q == 0) {
                        parents[it->vertex()] = v + 1;
                    }
                    else {
                        parents[it->vertex()] = -static_cast<std::ptrdiff_t>(v) - 1;
                    }
                    queues[q].push(it->vertex());
                }
            }
        }
        if(queues[0].empty() && queues[1].empty()) {
            return false;
        }
    }
}